

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c++
# Opt level: O3

Maybe<capnp::Orphan<capnp::compiler::Declaration>_> * __thiscall
capnp::compiler::CapnpParser::parseStatement
          (Maybe<capnp::Orphan<capnp::compiler::Declaration>_> *__return_storage_ptr__,
          CapnpParser *this,Reader statement,DeclParser *parser)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  *pIVar4;
  StructBuilder other;
  Reader statement_00;
  Orphan<capnp::compiler::Declaration> *pOVar5;
  RemoveConst<capnp::Orphan<capnp::compiler::Declaration>_> *pRVar6;
  Orphan<capnp::compiler::Declaration> *pOVar7;
  PointerType PVar8;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  *pIVar9;
  ulong uVar10;
  OrphanBuilder *pOVar11;
  ElementCount EVar12;
  undefined4 uVar13;
  DeclParser *pDVar14;
  size_t newSize;
  ErrorReporter *pEVar15;
  DeclParser *parser_00;
  OrphanBuilder *this_00;
  ulong uVar16;
  bool bVar17;
  undefined4 uVar18;
  Reader value;
  Vector<capnp::Orphan<capnp::compiler::Declaration>_> members;
  Reader memberStatements;
  ParserInput parserInput;
  Reader memberStatement;
  BuilderFor<capnp::compiler::Declaration> builder;
  Sequence_<const_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_const_kj::parse::EndOfInput__&>
  fullParser;
  Reader tokens;
  Vector<capnp::Orphan<capnp::compiler::Declaration>_> local_278;
  OrphanBuilder *local_250;
  Maybe<capnp::compiler::CapnpParser::DeclParserResult> local_248;
  undefined1 local_208 [16];
  SegmentBuilder *local_1f8;
  WirePointer *pWStack_1f0;
  word *local_1e8;
  Maybe<capnp::Orphan<capnp::compiler::Declaration>_> *local_1e0;
  OrphanBuilder *local_1d8;
  ulong uStack_1d0;
  ArrayDisposer *local_1c8;
  undefined1 local_1b8 [12];
  undefined4 uStack_1ac;
  SegmentBuilder *local_1a8;
  CapTableBuilder *pCStack_1a0;
  word *local_198;
  char local_190;
  DeclParser local_188;
  IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
  local_170;
  StructReader local_138;
  OrphanBuilder local_108;
  StructBuilder local_e8;
  bool local_c0 [8];
  anon_union_32_1_a8c68091_for_NullableValue<capnp::Orphan<capnp::compiler::Declaration>_>_2
  local_b8;
  OrphanBuilder local_98;
  Sequence_<const_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_const_kj::parse::EndOfInput__&>
  local_78;
  ListReader local_60;
  
  local_78.rest.first = (EndOfInput_ *)&kj::parse::endOfInput;
  local_1a8 = (SegmentBuilder *)statement._reader.pointers;
  if (statement._reader.pointerCount == 0) {
    local_1a8 = (SegmentBuilder *)(WirePointer *)0x0;
  }
  local_1b8._0_4_ = 0;
  local_1b8._4_4_ = 0;
  uVar13 = 0;
  uVar18 = 0;
  iVar3 = 0x7fffffff;
  if (statement._reader.pointerCount != 0) {
    local_1b8._0_4_ = statement._reader.segment._0_4_;
    local_1b8._4_4_ = statement._reader.segment._4_4_;
    uVar13 = statement._reader.capTable._0_4_;
    uVar18 = statement._reader.capTable._4_4_;
    iVar3 = statement._reader.nestingLimit;
  }
  stack0xfffffffffffffe50 = CONCAT44(uVar18,uVar13);
  pCStack_1a0 = (CapTableBuilder *)CONCAT44(pCStack_1a0._4_4_,iVar3);
  local_78.first = parser;
  capnp::_::PointerReader::getList
            (&local_60,(PointerReader *)local_1b8,INLINE_COMPOSITE,(word *)0x0);
  local_170.parent =
       (IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
        *)0x0;
  local_170.pos.index = 0;
  local_170.end.index = local_60.elementCount;
  local_170.best.index = 0;
  local_170.pos.container = (Reader *)&local_60;
  local_170.end.container = (Reader *)&local_60;
  local_170.best.container = (Reader *)&local_60;
  kj::parse::
  Sequence_<const_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_const_kj::parse::EndOfInput__&>
  ::
  parseNext<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>_>
            (&local_248,&local_78,&local_170);
  local_1b8[0] = local_248.ptr.isSet;
  if (local_248.ptr.isSet != true) {
    EVar12 = local_170.best.index;
    if (local_170.best.index < local_170.pos.index) {
      EVar12 = local_170.pos.index;
    }
    if (EVar12 == local_60.elementCount) {
      if (EVar12 == 0) goto joined_r0x003a9a8a;
      capnp::_::ListReader::getStructElement((StructReader *)&local_248,&local_60,EVar12 - 1);
      uVar10 = 0;
      if (0x9f < (uint)local_248.ptr.field_1._24_4_) {
        uVar10 = (ulong)*(uint *)&((local_248.ptr.field_1.value.decl.builder.segment)->
                                  super_SegmentReader).ptr.ptr;
      }
    }
    else {
      capnp::_::ListReader::getStructElement
                ((StructReader *)&local_248,
                 &((&local_170.pos)[(ulong)(local_170.pos.index <= local_170.best.index) * 2].
                  container)->reader,EVar12);
      statement._reader.data = local_248.ptr.field_1.value.decl.builder.segment;
      statement._reader.dataSize = local_248.ptr.field_1._24_4_;
joined_r0x003a9a8a:
      uVar10 = 0;
      if (0x3f < statement._reader.dataSize) {
        uVar10 = (ulong)*(uint *)((long)&(((SegmentBuilder *)statement._reader.data)->
                                         super_SegmentReader).arena + 4);
      }
    }
    (**this->errorReporter->_vptr_ErrorReporter)
              (this->errorReporter,uVar10,uVar10,"Parse error.",0xd);
    (__return_storage_ptr__->ptr).isSet = false;
    if ((local_1b8[0] == '\x01') && (local_1a8 != (SegmentBuilder *)0x0)) {
      capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)(local_1b8 + 8));
    }
    goto LAB_003aa0f5;
  }
  pCStack_1a0 = (CapTableBuilder *)
                CONCAT44(local_248.ptr.field_1._20_4_,local_248.ptr.field_1._16_4_);
  local_1a8 = local_248.ptr.field_1.value.decl.builder.segment;
  local_198 = local_248.ptr.field_1.value.decl.builder.location;
  stack0xfffffffffffffe50 = (uint64_t)local_248.ptr.field_1.value.decl.builder.tag.content;
  local_248.ptr.field_1.value.decl.builder.segment = (SegmentBuilder *)0x0;
  local_248.ptr.field_1.value.decl.builder.location = (word *)0x0;
  local_190 = local_248.ptr.field_1.value.memberParser.ptr.isSet;
  if (local_248.ptr.field_1.value.memberParser.ptr.isSet == true) {
    local_188.parser = (void *)local_248.ptr.field_1._40_8_;
    local_188.wrapper = (Wrapper *)local_248.ptr.field_1._48_8_;
  }
  pOVar11 = (OrphanBuilder *)(local_1b8 + 8);
  capnp::_::OrphanBuilder::asStruct(&local_e8,pOVar11,(StructSize)0x80002);
  if (statement._reader.pointerCount < 3) {
    local_248.ptr._0_8_ = (SegmentBuilder *)0x0;
    local_248.ptr.field_1.value.decl.builder.tag.content = (word)0;
    local_248.ptr.field_1.value.decl.builder.segment = (SegmentBuilder *)0x0;
    local_248.ptr.field_1._16_4_ = 0x7fffffff;
  }
  else {
    local_248.ptr.field_1.value.decl.builder.segment =
         (SegmentBuilder *)(statement._reader.pointers + 2);
    local_248.ptr._0_8_ = statement._reader.segment;
    local_248.ptr.field_1.value.decl.builder.tag.content = (word)statement._reader.capTable;
    local_248.ptr.field_1._16_4_ = statement._reader.nestingLimit;
  }
  PVar8 = capnp::_::PointerReader::getPointerType((PointerReader *)&local_248);
  if (PVar8 != NULL_) {
    local_248.ptr.field_1.value.decl.builder.segment =
         (SegmentBuilder *)(statement._reader.pointers + 2);
    if (statement._reader.pointerCount < 3) {
      local_248.ptr.field_1.value.decl.builder.segment = (SegmentBuilder *)0x0;
    }
    local_248.ptr._0_4_ = statement._reader.segment._0_4_;
    local_248.ptr._4_4_ = statement._reader.segment._4_4_;
    local_248.ptr.field_1.value.decl.builder.tag.content._0_4_ = statement._reader.capTable._0_4_;
    local_248.ptr.field_1.value.decl.builder.tag.content._4_4_ = statement._reader.capTable._4_4_;
    local_248.ptr.field_1._16_4_ = statement._reader.nestingLimit;
    if (statement._reader.pointerCount < 3) {
      local_248.ptr._0_4_ = 0;
      local_248.ptr._4_4_ = 0;
      local_248.ptr.field_1.value.decl.builder.tag.content._0_4_ = 0;
      local_248.ptr.field_1.value.decl.builder.tag.content._4_4_ = 0;
      local_248.ptr.field_1._16_4_ = 0x7fffffff;
    }
    value = capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_248,(void *)0x0,0)
    ;
    local_248.ptr.field_1.value.decl.builder.segment = (SegmentBuilder *)(local_e8.pointers + 4);
    local_248.ptr._0_8_ = local_e8.segment;
    local_248.ptr.field_1.value.decl.builder.tag.content = (word)(word)local_e8.capTable;
    capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_248,value);
  }
  if (statement._reader.dataSize < 0x40) {
    *(undefined8 *)((long)local_e8.data + 4) = 0;
    if (0xf < statement._reader.dataSize) {
      bVar17 = true;
      goto LAB_003a9b95;
    }
    if (local_190 == '\x01') {
      pEVar15 = this->errorReporter;
LAB_003a9b62:
      uVar16 = 0;
      uVar10 = 0;
LAB_003a9cc8:
      (**pEVar15->_vptr_ErrorReporter)
                (pEVar15,uVar16,uVar10,"This statement should end with a block, not a semicolon.",
                 0x39);
    }
  }
  else {
    *(undefined4 *)((long)local_e8.data + 4) = *(undefined4 *)((long)statement._reader.data + 4);
    uVar13 = 0;
    bVar17 = statement._reader.dataSize < 0x60;
    if (!bVar17) {
      uVar13 = *(undefined4 *)((long)statement._reader.data + 8);
    }
    *(undefined4 *)((long)local_e8.data + 8) = uVar13;
LAB_003a9b95:
    if (*statement._reader.data == 1) {
      pDVar14 = (DeclParser *)0x0;
      parser_00 = &local_188;
      if (local_190 == '\0') {
        parser_00 = pDVar14;
      }
      local_250 = pOVar11;
      local_1e0 = __return_storage_ptr__;
      if (local_190 == '\x01') {
        local_138.data = statement._reader.pointers + 1;
        if (statement._reader.pointerCount < 2) {
          local_138.data = (WirePointer *)0x0;
        }
        if (statement._reader.pointerCount < 2) {
          statement._reader.segment._0_4_ = 0;
          statement._reader.segment._4_4_ = 0;
          statement._reader.capTable._0_4_ = 0;
          statement._reader.capTable._4_4_ = 0;
          statement._reader.nestingLimit = 0x7fffffff;
        }
        local_138.segment =
             (SegmentReader *)
             CONCAT44(statement._reader.segment._4_4_,statement._reader.segment._0_4_);
        local_138.capTable =
             (CapTableReader *)
             CONCAT44(statement._reader.capTable._4_4_,statement._reader.capTable._0_4_);
        local_138.pointers._0_4_ = statement._reader.nestingLimit;
        capnp::_::PointerReader::getList
                  ((ListReader *)&local_248,(PointerReader *)&local_138,INLINE_COMPOSITE,(word *)0x0
                  );
        uVar10 = (ulong)(uint)local_248.ptr.field_1._16_4_;
        local_278.builder.ptr =
             (Orphan<capnp::compiler::Declaration> *)
             kj::_::HeapArrayDisposer::allocateImpl
                       (0x20,0,uVar10,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
        uVar13 = local_248.ptr.field_1._16_4_;
        local_278.builder.endPtr =
             (Orphan<capnp::compiler::Declaration> *)
             ((OrphanBuilder *)local_278.builder.ptr + uVar10);
        local_278.builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
        local_278.builder.pos = local_278.builder.ptr;
        if (local_248.ptr.field_1._16_4_ != 0) {
          EVar12 = 0;
          do {
            capnp::_::ListReader::getStructElement(&local_138,(ListReader *)&local_248,EVar12);
            statement_00._reader.pointers._4_4_ = local_138.pointers._4_4_;
            statement_00._reader.pointers._0_4_ = (int)local_138.pointers;
            statement_00._reader.capTable = local_138.capTable;
            statement_00._reader.segment = local_138.segment;
            statement_00._reader.data = local_138.data;
            statement_00._reader.dataSize = local_138.dataSize;
            statement_00._reader.pointerCount = local_138.pointerCount;
            statement_00._reader._38_2_ = local_138._38_2_;
            statement_00._reader.nestingLimit = local_138.nestingLimit;
            statement_00._reader._44_4_ = local_138._44_4_;
            parseStatement((Maybe<capnp::Orphan<capnp::compiler::Declaration>_> *)local_c0,this,
                           statement_00,parser_00);
            local_208[0] = local_c0[0];
            if (local_c0[0] == true) {
              local_1f8 = local_b8.value.builder.segment;
              pWStack_1f0 = (WirePointer *)local_b8.value.builder.capTable;
              local_1e8 = local_b8.value.builder.location;
              local_208._8_8_ = local_b8.value.builder.tag.content;
              if (local_278.builder.pos == local_278.builder.endPtr) {
                newSize = (long)local_278.builder.pos - (long)local_278.builder.ptr >> 4;
                if (local_278.builder.pos == local_278.builder.ptr) {
                  newSize = 4;
                }
                kj::Vector<capnp::Orphan<capnp::compiler::Declaration>_>::setCapacity
                          (&local_278,newSize);
              }
              *(SegmentBuilder **)((long)local_278.builder.pos + 8) = local_1f8;
              *(WirePointer **)((long)local_278.builder.pos + 0x10) = pWStack_1f0;
              *(word **)((long)local_278.builder.pos + 0x18) = local_1e8;
              ((local_278.builder.pos)->builder).tag.content = local_208._8_8_;
              local_278.builder.pos = local_278.builder.pos + 1;
            }
            else if ((local_c0[0] != false) && (local_1f8 != (SegmentBuilder *)0x0)) {
              capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)(local_208 + 8));
            }
            EVar12 = EVar12 + 1;
          } while (uVar13 != EVar12);
        }
        pOVar11 = &(local_278.builder.endPtr)->builder;
        this_00 = &(local_278.builder.ptr)->builder;
        if (local_278.builder.pos != local_278.builder.endPtr) {
          kj::Vector<capnp::Orphan<capnp::compiler::Declaration>_>::setCapacity
                    (&local_278,(long)local_278.builder.pos - (long)local_278.builder.ptr >> 5);
          pOVar11 = &(local_278.builder.pos)->builder;
          this_00 = &(local_278.builder.ptr)->builder;
        }
        uStack_1d0 = (long)pOVar11 - (long)this_00 >> 5;
        local_1c8 = local_278.builder.disposer;
        local_278.builder.ptr = (Orphan<capnp::compiler::Declaration> *)0x0;
        local_278.builder.pos = (RemoveConst<capnp::Orphan<capnp::compiler::Declaration>_> *)0x0;
        local_278.builder.endPtr = (Orphan<capnp::compiler::Declaration> *)0x0;
        local_1d8 = this_00;
        capnp::_::OrphanBuilder::initStructList
                  ((OrphanBuilder *)&local_138,(this->orphanage).arena,(this->orphanage).capTable,
                   (ElementCount)uStack_1d0,(StructSize)0x80002);
        local_108.segment = (SegmentBuilder *)local_138.capTable;
        local_108.capTable = (CapTableBuilder *)local_138.data;
        local_108.location = (word *)CONCAT44(local_138.pointers._4_4_,(int)local_138.pointers);
        local_108.tag.content = (uint64_t)local_138.segment;
        capnp::_::OrphanBuilder::asStructList
                  ((ListBuilder *)local_c0,&local_108,(StructSize)0x80002);
        if (pOVar11 == this_00) {
          uVar10 = 0;
        }
        else {
          uVar16 = 0;
          do {
            capnp::_::ListBuilder::getStructElement
                      ((StructBuilder *)&local_138,(ListBuilder *)local_c0,(ElementCount)uVar16);
            capnp::_::OrphanBuilder::asStruct((StructBuilder *)local_208,this_00,(StructSize)0x0);
            other.segment._1_7_ = local_208._1_7_;
            other.segment._0_1_ = local_208[0];
            other.capTable = (CapTableBuilder *)local_208._8_8_;
            other.data = local_1f8;
            other.pointers = pWStack_1f0;
            other._32_8_ = local_1e8;
            capnp::_::StructBuilder::transferContentFrom((StructBuilder *)&local_138,other);
            uVar16 = uVar16 + 1;
            this_00 = this_00 + 1;
            uVar10 = uStack_1d0;
          } while (uVar16 < uStack_1d0);
        }
        local_98.segment = local_108.segment;
        local_98.capTable = local_108.capTable;
        local_98.location = local_108.location;
        local_98.tag.content = local_108.tag.content;
        local_138.data = local_e8.pointers + 2;
        local_138.segment = &(local_e8.segment)->super_SegmentReader;
        local_138.capTable = &(local_e8.capTable)->super_CapTableReader;
        capnp::_::PointerBuilder::adopt((PointerBuilder *)&local_138,&local_98);
        if (local_98.segment != (SegmentBuilder *)0x0) {
          capnp::_::OrphanBuilder::euthanize(&local_98);
        }
        pOVar11 = local_1d8;
        if (local_1d8 != (OrphanBuilder *)0x0) {
          local_1d8 = (OrphanBuilder *)0x0;
          uStack_1d0 = 0;
          (**local_1c8->_vptr_ArrayDisposer)
                    (local_1c8,pOVar11,0x20,uVar10,uVar10,
                     kj::ArrayDisposer::Dispose_<capnp::Orphan<capnp::compiler::Declaration>_>::
                     destruct);
        }
        pOVar7 = local_278.builder.endPtr;
        pRVar6 = local_278.builder.pos;
        pOVar5 = local_278.builder.ptr;
        __return_storage_ptr__ = local_1e0;
        if (local_278.builder.ptr != (Orphan<capnp::compiler::Declaration> *)0x0) {
          local_278.builder.ptr = (Orphan<capnp::compiler::Declaration> *)0x0;
          local_278.builder.pos = (RemoveConst<capnp::Orphan<capnp::compiler::Declaration>_> *)0x0;
          local_278.builder.endPtr = (Orphan<capnp::compiler::Declaration> *)0x0;
          (**(local_278.builder.disposer)->_vptr_ArrayDisposer)
                    (local_278.builder.disposer,pOVar5,0x20,(long)pRVar6 - (long)pOVar5 >> 5,
                     (long)pOVar7 - (long)pOVar5 >> 5,
                     kj::ArrayDisposer::Dispose_<capnp::Orphan<capnp::compiler::Declaration>_>::
                     destruct);
          __return_storage_ptr__ = local_1e0;
        }
      }
      else {
        if (0x3f < statement._reader.dataSize) {
          pDVar14 = (DeclParser *)(ulong)*(uint *)((long)statement._reader.data + 4);
        }
        uVar10 = 0;
        if (!bVar17) {
          uVar10 = (ulong)*(uint *)((long)statement._reader.data + 8);
        }
        (**this->errorReporter->_vptr_ErrorReporter)
                  (this->errorReporter,pDVar14,uVar10,
                   "This statement should end with a semicolon, not a block.",0x39);
      }
    }
    else if ((*statement._reader.data == 0) && (local_190 != '\0')) {
      pEVar15 = this->errorReporter;
      if (statement._reader.dataSize < 0x40) {
        uVar16 = 0;
        if (bVar17) goto LAB_003a9b62;
      }
      else {
        uVar16 = (ulong)*(uint *)((long)statement._reader.data + 4);
        uVar10 = 0;
        if (bVar17) goto LAB_003a9cc8;
      }
      uVar10 = (ulong)*(uint *)((long)statement._reader.data + 8);
      goto LAB_003a9cc8;
    }
  }
  (__return_storage_ptr__->ptr).isSet = true;
  (__return_storage_ptr__->ptr).field_1.value.builder.segment = local_1a8;
  (__return_storage_ptr__->ptr).field_1.value.builder.capTable = pCStack_1a0;
  (__return_storage_ptr__->ptr).field_1.value.builder.location = local_198;
  (__return_storage_ptr__->ptr).field_1.value.builder.tag.content = stack0xfffffffffffffe50;
LAB_003aa0f5:
  if (local_170.parent !=
      (IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
       *)0x0) {
    pIVar4 = &local_170.best;
    if (local_170.best.index < local_170.pos.index) {
      local_170.best.index = local_170.pos.index;
      pIVar4 = &local_170.pos;
    }
    uVar1 = ((local_170.parent)->best).index;
    uVar2 = local_170.best.index;
    if (local_170.best.index <= uVar1) {
      uVar2 = uVar1;
    }
    pIVar9 = &(local_170.parent)->best;
    if (uVar1 < local_170.best.index) {
      pIVar9 = pIVar4;
    }
    ((local_170.parent)->best).container = pIVar9->container;
    ((local_170.parent)->best).index = uVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Orphan<Declaration>> CapnpParser::parseStatement(
    Statement::Reader statement, const DeclParser& parser) {
  auto fullParser = p::sequence(parser, p::endOfInput);

  auto tokens = statement.getTokens();
  ParserInput parserInput(tokens.begin(), tokens.end());

  KJ_IF_SOME(output, fullParser(parserInput)) {
    auto builder = output.decl.get();

    if (statement.hasDocComment()) {
      builder.setDocComment(statement.getDocComment());
    }

    builder.setStartByte(statement.getStartByte());
    builder.setEndByte(statement.getEndByte());

    switch (statement.which()) {
      case Statement::LINE:
        if (output.memberParser != kj::none) {
          errorReporter.addError(statement.getStartByte(), statement.getEndByte(),
              "This statement should end with a block, not a semicolon.");
        }
        break;

      case Statement::BLOCK:
        KJ_IF_SOME(memberParser, output.memberParser) {
          auto memberStatements = statement.getBlock();
          kj::Vector<Orphan<Declaration>> members(memberStatements.size());
          for (auto memberStatement: memberStatements) {
            KJ_IF_SOME(member, parseStatement(memberStatement, memberParser)) {
              members.add(kj::mv(member));
            }
          }
          builder.adoptNestedDecls(arrayToList(orphanage, members.releaseAsArray()));
        } else {
          errorReporter.addError(statement.getStartByte(), statement.getEndByte(),
              "This statement should end with a semicolon, not a block.");
        }
        break;
    }

    return kj::mv(output.decl);

  }